

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O3

int Abc_CommandBalance(Abc_Frame_t *pAbc,int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  Abc_Ntk_t *pAVar3;
  Abc_Ntk_t *pNtk;
  char *pcVar4;
  char *pcVar5;
  uint fVerbose;
  uint fUpdateLevel;
  uint local_44;
  uint local_40;
  
  pAVar3 = Abc_FrameReadNtk(pAbc);
  local_44 = 0;
  Extra_UtilGetoptReset();
  fUpdateLevel = 1;
  local_40 = 0;
  bVar1 = false;
  fVerbose = 0;
LAB_0024e5ec:
  do {
    while( true ) {
      while (iVar2 = Extra_UtilGetopt(argc,argv,"ldsxvh"), iVar2 == 0x76) {
        fVerbose = fVerbose ^ 1;
      }
      if (0x6b < iVar2) break;
      if (iVar2 == -1) {
        if (pAVar3 == (Abc_Ntk_t *)0x0) {
          pcVar4 = "Empty network.\n";
        }
        else {
          if (pAVar3->ntkType == ABC_NTK_STRASH) {
            if (bVar1) {
              pNtk = Abc_NtkBalanceExor(pAVar3,fUpdateLevel,fVerbose);
            }
            else {
              pNtk = Abc_NtkBalance(pAVar3,local_44,local_40,fUpdateLevel);
            }
          }
          else {
            pAVar3 = Abc_NtkStrash(pAVar3,0,0,0);
            if (pAVar3 == (Abc_Ntk_t *)0x0) {
              pcVar4 = "Strashing before balancing has failed.\n";
              goto LAB_0024e7dd;
            }
            if (bVar1) {
              pNtk = Abc_NtkBalanceExor(pAVar3,fUpdateLevel,fVerbose);
            }
            else {
              pNtk = Abc_NtkBalance(pAVar3,local_44,local_40,fUpdateLevel);
            }
            Abc_NtkDelete(pAVar3);
          }
          if (pNtk != (Abc_Ntk_t *)0x0) {
            Abc_FrameReplaceCurrentNetwork(pAbc,pNtk);
            return 0;
          }
          pcVar4 = "Balancing has failed.\n";
        }
LAB_0024e7dd:
        iVar2 = -1;
        goto LAB_0024e7e2;
      }
      if (iVar2 != 100) goto LAB_0024e66e;
      local_44 = local_44 ^ 1;
    }
    if (iVar2 == 0x78) {
      bVar1 = (bool)(bVar1 ^ 1);
      goto LAB_0024e5ec;
    }
    if (iVar2 == 0x73) {
      local_40 = local_40 ^ 1;
    }
    else {
      if (iVar2 != 0x6c) {
LAB_0024e66e:
        Abc_Print(-2,"usage: balance [-ldsxvh]\n");
        Abc_Print(-2,"\t        transforms the current network into a well-balanced AIG\n");
        pcVar5 = "yes";
        pcVar4 = "yes";
        if (fUpdateLevel == 0) {
          pcVar4 = "no";
        }
        Abc_Print(-2,"\t-l    : toggle minimizing the number of levels [default = %s]\n",pcVar4);
        pcVar4 = "yes";
        if (local_44 == 0) {
          pcVar4 = "no";
        }
        Abc_Print(-2,"\t-d    : toggle duplication of logic [default = %s]\n",pcVar4);
        pcVar4 = "yes";
        if (local_40 == 0) {
          pcVar4 = "no";
        }
        Abc_Print(-2,"\t-s    : toggle duplication on the critical paths [default = %s]\n",pcVar4);
        pcVar4 = "yes";
        if (!bVar1) {
          pcVar4 = "no";
        }
        Abc_Print(-2,"\t-x    : toggle balancing multi-input EXORs [default = %s]\n",pcVar4);
        if (fVerbose == 0) {
          pcVar5 = "no";
        }
        Abc_Print(-2,"\t-v    : print verbose information [default = %s]\n",pcVar5);
        pcVar4 = "\t-h    : print the command usage\n";
        iVar2 = -2;
LAB_0024e7e2:
        Abc_Print(iVar2,pcVar4);
        return 1;
      }
      fUpdateLevel = fUpdateLevel ^ 1;
    }
  } while( true );
}

Assistant:

int Abc_CommandBalance( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Abc_Ntk_t * pNtk, * pNtkRes, * pNtkTemp;
    int c;
    int fDuplicate;
    int fSelective;
    int fUpdateLevel;
    int fExor;
    int fVerbose;
    pNtk = Abc_FrameReadNtk(pAbc);

    // set defaults
    fDuplicate   = 0;
    fSelective   = 0;
    fUpdateLevel = 1;
    fExor        = 0;
    fVerbose     = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "ldsxvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'l':
            fUpdateLevel ^= 1;
            break;
        case 'd':
            fDuplicate ^= 1;
            break;
        case 's':
            fSelective ^= 1;
            break;
        case 'x':
            fExor ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }

    if ( pNtk == NULL )
    {
        Abc_Print( -1, "Empty network.\n" );
        return 1;
    }
    // get the new network
    if ( Abc_NtkIsStrash(pNtk) )
    {
        if ( fExor )
            pNtkRes = Abc_NtkBalanceExor( pNtk, fUpdateLevel, fVerbose );
        else
            pNtkRes = Abc_NtkBalance( pNtk, fDuplicate, fSelective, fUpdateLevel );
    }
    else
    {
        pNtkTemp = Abc_NtkStrash( pNtk, 0, 0, 0 );
        if ( pNtkTemp == NULL )
        {
            Abc_Print( -1, "Strashing before balancing has failed.\n" );
            return 1;
        }
        if ( fExor )
            pNtkRes = Abc_NtkBalanceExor( pNtkTemp, fUpdateLevel, fVerbose );
        else
            pNtkRes = Abc_NtkBalance( pNtkTemp, fDuplicate, fSelective, fUpdateLevel );
        Abc_NtkDelete( pNtkTemp );
    }

    // check if balancing worked
    if ( pNtkRes == NULL )
    {
        Abc_Print( -1, "Balancing has failed.\n" );
        return 1;
    }
    // replace the current network
    Abc_FrameReplaceCurrentNetwork( pAbc, pNtkRes );
    return 0;

usage:
    Abc_Print( -2, "usage: balance [-ldsxvh]\n" );
    Abc_Print( -2, "\t        transforms the current network into a well-balanced AIG\n" );
    Abc_Print( -2, "\t-l    : toggle minimizing the number of levels [default = %s]\n", fUpdateLevel? "yes": "no" );
    Abc_Print( -2, "\t-d    : toggle duplication of logic [default = %s]\n", fDuplicate? "yes": "no" );
    Abc_Print( -2, "\t-s    : toggle duplication on the critical paths [default = %s]\n", fSelective? "yes": "no" );
    Abc_Print( -2, "\t-x    : toggle balancing multi-input EXORs [default = %s]\n", fExor? "yes": "no" );
    Abc_Print( -2, "\t-v    : print verbose information [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h    : print the command usage\n");
    return 1;
}